

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void btreeReleaseAllCursorPages(BtCursor *pCur)

{
  int local_14;
  int i;
  BtCursor *pCur_local;
  
  if (-1 < pCur->iPage) {
    for (local_14 = 0; local_14 < pCur->iPage; local_14 = local_14 + 1) {
      releasePageNotNull(pCur->apPage[local_14]);
    }
    releasePageNotNull(pCur->pPage);
    pCur->iPage = -1;
  }
  return;
}

Assistant:

static void btreeReleaseAllCursorPages(BtCursor *pCur){
  int i;
  if( pCur->iPage>=0 ){
    for(i=0; i<pCur->iPage; i++){
      releasePageNotNull(pCur->apPage[i]);
    }
    releasePageNotNull(pCur->pPage);
    pCur->iPage = -1;
  }
}